

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_from_decimal_pl(ptrlen decimal)

{
  mp_int *r;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = decimal.len;
  if (uVar1 < 0x14e5e0a72f05397) {
    r = mp_make_sized((uVar1 * 0xc4) / 0xec0 + 1);
    if (uVar1 != 0) {
      mp_add_integer_into(r,r,(long)*decimal.ptr - 0x30);
      if (uVar1 != 1) {
        uVar2 = 1;
        do {
          mp_mul_integer_into(r,r,10);
          mp_add_integer_into(r,r,(long)*(char *)((long)decimal.ptr + uVar2) - 0x30);
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
    }
    return r;
  }
  __assert_fail("decimal.len < (~(size_t)0) / 196",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0xe7,"mp_int *mp_from_decimal_pl(ptrlen)");
}

Assistant:

mp_int *mp_from_decimal_pl(ptrlen decimal)
{
    /* 196/59 is an upper bound (and also a continued-fraction
     * convergent) for log2(10), so this conservatively estimates the
     * number of bits that will be needed to store any number that can
     * be written in this many decimal digits. */
    assert(decimal.len < (~(size_t)0) / 196);
    size_t bits = 196 * decimal.len / 59;

    /* Now round that up to words. */
    size_t words = bits / BIGNUM_INT_BITS + 1;

    mp_int *x = mp_make_sized(words);
    for (size_t i = 0; i < decimal.len; i++) {
        mp_add_integer_into(x, x, ((const char *)decimal.ptr)[i] - '0');

        if (i+1 == decimal.len)
            break;

        mp_mul_integer_into(x, x, 10);
    }
    return x;
}